

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_prefix_coding.cpp
# Opt level: O3

bool lzham::prefix_coding::limit_max_code_size(uint num_syms,uint8 *pCodesizes,uint max_code_size)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint i;
  uint uVar5;
  long lVar6;
  uint8 *__s;
  byte bVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint num_codes [35];
  uint next_sorted_ofs [35];
  uint8 new_codesizes [1024];
  uint local_558 [36];
  uint auStack_4c8 [36];
  uint8 local_438 [1032];
  
  if (max_code_size - 0x23 < 0xffffffde || num_syms - 0x401 < 0xfffffc00) {
    return false;
  }
  uVar11 = 0;
  memset(local_558,0,0x8c);
  bVar7 = 0;
  do {
    bVar2 = bVar7;
    bVar7 = pCodesizes[uVar11];
    local_558[bVar7] = local_558[bVar7] + 1;
    bVar1 = max_code_size < bVar7;
    uVar11 = uVar11 + 1;
    bVar7 = bVar2 | bVar1;
  } while (num_syms != uVar11);
  if (!(bool)(bVar2 | bVar1)) {
    return true;
  }
  uVar9 = 0;
  lVar6 = 1;
  do {
    auStack_4c8[lVar6] = uVar9;
    uVar9 = uVar9 + local_558[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x23);
  if (uVar9 - 0x401 < 0xfffffc01) {
    return true;
  }
  uVar5 = 1 << ((byte)max_code_size & 0x1f);
  if (uVar5 < uVar9) {
    return false;
  }
  uVar11 = (ulong)max_code_size;
  if (max_code_size < 0x22) {
    uVar9 = local_558[uVar11];
    lVar6 = uVar11 + 1;
    do {
      uVar9 = uVar9 + local_558[lVar6];
      local_558[uVar11] = uVar9;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x23);
    if (max_code_size == 0) {
      bVar1 = true;
      uVar9 = 0;
      goto LAB_001139ee;
    }
  }
  bVar7 = 0;
  uVar9 = 0;
  uVar8 = uVar11;
  do {
    uVar10 = uVar8 - 1;
    uVar9 = uVar9 + (local_558[uVar8] << (bVar7 & 0x1f));
    bVar7 = bVar7 + 1;
    uVar8 = uVar10;
  } while ((int)uVar10 != 0);
  if (uVar9 == uVar5) {
    return true;
  }
  bVar1 = false;
LAB_001139ee:
  do {
    local_558[uVar11] = local_558[uVar11] - 1;
    uVar4 = max_code_size - 1;
    do {
      uVar3 = uVar4;
      if (uVar3 == 0) {
        return false;
      }
      uVar4 = uVar3 - 1;
    } while (local_558[uVar3] == 0);
    local_558[uVar3] = local_558[uVar3] - 1;
    local_558[uVar3 + 1] = local_558[uVar3 + 1] + 2;
    uVar9 = uVar9 - 1;
  } while (uVar9 != uVar5);
  if (!bVar1) {
    __s = local_438;
    uVar11 = 1;
    do {
      uVar8 = (ulong)local_558[uVar11];
      if (uVar8 != 0) {
        memset(__s,(int)uVar11,uVar8);
        __s = __s + uVar8;
      }
      uVar11 = uVar11 + 1;
    } while (max_code_size + 1 != uVar11);
  }
  uVar11 = 0;
  do {
    uVar8 = (ulong)pCodesizes[uVar11];
    if (uVar8 != 0) {
      uVar9 = auStack_4c8[uVar8];
      auStack_4c8[uVar8] = uVar9 + 1;
      pCodesizes[uVar11] = local_438[uVar9];
    }
    uVar11 = uVar11 + 1;
  } while (num_syms != uVar11);
  return true;
}

Assistant:

bool limit_max_code_size(uint num_syms, uint8* pCodesizes, uint max_code_size)
      {
         const uint cMaxEverCodeSize = 34;            
         
         if ((!num_syms) || (num_syms > cMaxSupportedSyms) || (max_code_size < 1) || (max_code_size > cMaxEverCodeSize))
         {
            LZHAM_LOG_ERROR(3000);
            return false;
         }
         
         uint num_codes[cMaxEverCodeSize + 1];
         utils::zero_object(num_codes);

         bool should_limit = false;
         
         for (uint i = 0; i < num_syms; i++)
         {
            uint c = pCodesizes[i];
            
            LZHAM_ASSERT(c <= cMaxEverCodeSize);
            
            num_codes[c]++;
            if (c > max_code_size)
               should_limit = true;
         }
         
         if (!should_limit)
            return true;
         
         uint ofs = 0;
         uint next_sorted_ofs[cMaxEverCodeSize + 1];
         for (uint i = 1; i <= cMaxEverCodeSize; i++)
         {
            next_sorted_ofs[i] = ofs;
            ofs += num_codes[i];
         }
            
         if ((ofs < 2) || (ofs > cMaxSupportedSyms))
            return true;
         
         if (ofs > (1U << max_code_size))
         {
            LZHAM_LOG_ERROR(3001);
            return false;
         }
                           
         for (uint i = max_code_size + 1; i <= cMaxEverCodeSize; i++)
            num_codes[max_code_size] += num_codes[i];
         
         // Technique of adjusting tree to enforce maximum code size from LHArc. 
			// (If you remember what LHArc was, you've been doing this for a LONG time.)
         
         uint total = 0;
         for (uint i = max_code_size; i; --i)
            total += (num_codes[i] << (max_code_size - i));

         if (total == (1U << max_code_size))  
            return true;
            
         do
         {
            num_codes[max_code_size]--;

            uint i;
            for (i = max_code_size - 1; i; --i)
            {
               if (!num_codes[i])
                  continue;
               num_codes[i]--;          
               num_codes[i + 1] += 2;   
               break;
            }
            if (!i)
            {
               LZHAM_LOG_ERROR(3002);
               return false;
            }

            total--;   
         } while (total != (1U << max_code_size));
         
         uint8 new_codesizes[cMaxSupportedSyms];
         uint8* p = new_codesizes;
         for (uint i = 1; i <= max_code_size; i++)
         {
            uint n = num_codes[i];
            if (n)
            {
               memset(p, i, n);
               p += n;
            }
         }
                                             
         for (uint i = 0; i < num_syms; i++)
         {
            const uint c = pCodesizes[i];
            if (c)
            {
               uint next_ofs = next_sorted_ofs[c];
               next_sorted_ofs[c] = next_ofs + 1;
            
               pCodesizes[i] = static_cast<uint8>(new_codesizes[next_ofs]);
            }
         }
            
         return true;
      }